

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

HRESULT __thiscall
Js::SourceTextModuleRecord::ParseSource
          (SourceTextModuleRecord *this,byte *sourceText,uint32 sourceLength,SRCINFO *srcInfo,
          Var *exceptionVar,bool isUtf8)

{
  Type *addr;
  Type *addr_00;
  long lVar1;
  Type *addr_01;
  ScriptContext *pSVar2;
  Var pvVar3;
  void *pvVar4;
  ThreadContext *pTVar5;
  code *pcVar6;
  BSTR pWVar7;
  bool bVar8;
  int iVar9;
  HRESULT HVar10;
  BOOL BVar11;
  Data DVar12;
  undefined4 *puVar13;
  JavascriptString *pJVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Parser *pPVar16;
  ParseNodeProg *pPVar17;
  undefined4 extraout_var_01;
  size_t sVar18;
  Recycler *this_00;
  PCWSTR message;
  WCHAR *sourceUrl;
  JavascriptError *pJVar19;
  undefined4 extraout_var_03;
  void *__frameAddr;
  size_t sizeInBytes;
  ScriptContext *pSVar20;
  size_t size;
  undefined1 auStack_e8 [8];
  CompileScriptException se;
  Utf8SourceInfo *pResultSourceInfo;
  AutoNestedHandledExceptionType local_3c;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  char16_t *pcVar15;
  undefined4 extraout_var_02;
  
  if ((sourceText != (byte *)0x0) && (this->wasParsed != false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x52,"(!wasParsed || sourceText == nullptr)",
                                "!wasParsed || sourceText == nullptr");
    if (!bVar8) goto LAB_00b0334d;
    *puVar13 = 0;
  }
  if (this->parser != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x53,"(parser == nullptr)","parser == nullptr");
    if (!bVar8) goto LAB_00b0334d;
    *puVar13 = 0;
  }
  if (exceptionVar == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x54,"(exceptionVar != nullptr)","exceptionVar != nullptr");
    if (!bVar8) goto LAB_00b0334d;
    *puVar13 = 0;
  }
  if ((sourceText == (byte *)0x0) && (this->wasParsed != false)) {
    return 0;
  }
  pSVar2 = (this->scriptContext).ptr;
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  auStack_e8._0_4_ = 0;
  auStack_e8._4_4_ = 0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  *exceptionVar = (Var)0x0;
  if (((pSVar2->config).threadConfig)->m_ES6Module == false) {
    pJVar19 = JavascriptLibrary::CreateError((pSVar2->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar19,0,L"ES6Module not supported",pSVar2);
    *exceptionVar = pJVar19;
    HVar10 = -0x7fffbfff;
    goto LAB_00b0332c;
  }
  if ((this->promise).ptr == (JavascriptPromise *)0x0 &&
      (this->parentModuleList).ptr ==
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this->isRootModule = true;
  }
  pSStack_38 = pSVar2;
  if (sourceText == (byte *)0x0) {
    if (sourceLength != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x73,"(sourceLength == 0)","sourceLength == 0");
      if (!bVar8) goto LAB_00b0334d;
      *puVar13 = 0;
    }
    pvVar3 = (this->normalizedSpecifier).ptr;
    if (pvVar3 == (Var)0x0) {
      pcVar15 = L"module";
    }
    else {
      pJVar14 = VarTo<Js::JavascriptString>(pvVar3);
      iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
      pcVar15 = (char16_t *)CONCAT44(extraout_var_00,iVar9);
    }
    Output::TraceWithFlush(ModulePhase,L"Failed to load: %s\n",pcVar15);
    pvVar3 = (this->normalizedSpecifier).ptr;
    if (pvVar3 == (Var)0x0) {
      pcVar15 = L"module";
      pSVar20 = pSStack_38;
    }
    else {
      pJVar14 = VarTo<Js::JavascriptString>(pvVar3);
      pSVar20 = pSStack_38;
      iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
      pcVar15 = (char16_t *)CONCAT44(extraout_var_01,iVar9);
    }
    sVar18 = PAL_wcslen(pcVar15);
    lVar1 = sVar18 + 1;
    se.bstrLine = L"窠Ŕ";
    this_00 = Memory::Recycler::TrackAllocInfo(pSVar20->recycler,(TrackAllocData *)&se.bstrLine);
    if (lVar1 == 0) {
      message = (PCWSTR)&DAT_00000008;
      sizeInBytes = 0;
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    }
    else {
      sizeInBytes = lVar1 * 2;
      size = 0xffffffffffffffff;
      if (-1 < lVar1) {
        size = sizeInBytes;
      }
      BVar11 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar11 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_00b0334d;
        *puVar13 = 0;
      }
      message = (PCWSTR)Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_00,size);
      if (message == (PCWSTR)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) {
LAB_00b0334d:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar13 = 0;
        message = (PCWSTR)0x0;
      }
    }
    memcpy_s(message,sizeInBytes,pcVar15,sVar18 * 2);
    pSVar20 = pSStack_38;
    message[sVar18] = L'\0';
    pJVar19 = JavascriptLibrary::CreateURIError
                        ((pSStack_38->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar19,-0x7fffbffb,message,pSVar20);
    *exceptionVar = pJVar19;
    HVar10 = -0x7fffbffb;
  }
  else {
    pvVar3 = (this->normalizedSpecifier).ptr;
    if (pvVar3 == (Var)0x0) {
      pcVar15 = L"module";
    }
    else {
      pJVar14 = VarTo<Js::JavascriptString>(pvVar3);
      iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
      pcVar15 = (char16_t *)CONCAT44(extraout_var,iVar9);
    }
    Output::TraceWithFlush(ModulePhase,L"ParseSource(%s)\n",pcVar15);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_3c,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pSVar20 = pSStack_38;
    pPVar16 = (Parser *)new<Memory::ArenaAllocator>(0xaa8,&pSVar2->generalAllocator,0x364470);
    Parser::Parser(pPVar16,pSVar20,0,(PageAllocator *)0x0,false,0xaa8);
    this->parser = pPVar16;
    srcInfo->moduleID = this->moduleId;
    se.bstrLine = (BSTR)0x0;
    pPVar17 = ScriptContext::ParseScript
                        (pSVar20,pPVar16,sourceText,(ulong)sourceLength,srcInfo,
                         (CompileScriptException *)auStack_e8,(Utf8SourceInfo **)&se.bstrLine,
                         L"Module code",
                         (uint)isUtf8 << 6 |
                         (LoadScriptFlag_Module|LoadScriptFlag_disableAsmJs|
                         LoadScriptFlag_Expression),&this->sourceIndex,(Var)0x0);
    addr = &this->parseTree;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pPVar17;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar7 = se.bstrLine;
    addr_00 = &this->pSourceInfo;
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = (Utf8SourceInfo *)pWVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
    if (addr->ptr == (ParseNodeProg *)0x0) {
      HVar10 = -0x7fffbffb;
    }
    else {
      HVar10 = PostParseProcess(this);
      if (HVar10 == 0) {
        pvVar4 = (this->errorObject).ptr;
        HVar10 = 0;
        if ((pvVar4 != (void *)0x0) && (this->hadNotifyHostReady == true)) {
          if (*exceptionVar == (Var)0x0) {
            *exceptionVar = pvVar4;
          }
          HVar10 = -0x7fffbffb;
          ReleaseParserResourcesForHierarchy(this);
        }
        goto LAB_00b0332c;
      }
      if (-1 < HVar10) goto LAB_00b0332c;
    }
    pJVar19 = (JavascriptError *)*exceptionVar;
  }
  if (pJVar19 == (JavascriptError *)0x0) {
    pvVar3 = (this->normalizedSpecifier).ptr;
    if (pvVar3 == (Var)0x0) {
      sourceUrl = L"module";
    }
    else {
      pJVar14 = VarTo<Js::JavascriptString>(pvVar3);
      iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
      sourceUrl = (WCHAR *)CONCAT44(extraout_var_02,iVar9);
    }
    pJVar19 = JavascriptError::CreateFromCompileScriptException
                        (pSStack_38,(CompileScriptException *)auStack_e8,sourceUrl);
    *exceptionVar = pJVar19;
  }
  ReleaseParserResourcesForHierarchy(this);
  pPVar16 = this->parser;
  if (pPVar16 != (Parser *)0x0) {
    (this->parseTree).ptr = (ParseNodeProg *)0x0;
    Parser::~Parser(pPVar16);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&(pSVar2->generalAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,pPVar16,
               0xaa8);
    this->parser = (Type)0x0;
  }
  if ((this->errorObject).ptr == (void *)0x0) {
    addr_01 = &this->errorObject;
    pvVar4 = *exceptionVar;
    Memory::Recycler::WBSetBit((char *)addr_01);
    addr_01->ptr = pvVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  }
  if ((this->promise).ptr != (JavascriptPromise *)0x0) {
    ResolveOrRejectDynamicImportPromise
              (false,(this->errorObject).ptr,(this->scriptContext).ptr,this,false);
  }
  if ((this->isRootModule == true) && (this->hadNotifyHostReady == false)) {
    pvVar3 = (this->normalizedSpecifier).ptr;
    if (pvVar3 == (Var)0x0) {
      pcVar15 = L"module";
    }
    else {
      pJVar14 = VarTo<Js::JavascriptString>(pvVar3);
      iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
      pcVar15 = (char16_t *)CONCAT44(extraout_var_03,iVar9);
    }
    Output::TraceWithFlush
              (ModulePhase,L"\t>NotifyHostAboutModuleReady %s (ParseSource error)\n",pcVar15);
    pSVar2 = pSStack_38;
    if (pSStack_38->threadContext->isScriptActive == true) {
      LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)&se.bstrLine,pSStack_38,
                 &stack0xfffffffffffffff8);
      pTVar5 = pSVar2->threadContext;
      bVar8 = pTVar5->reentrancySafeOrHandled;
      pTVar5->reentrancySafeOrHandled = true;
      (*pSVar2->hostScriptContext->_vptr_HostScriptContext[0x14])
                (pSVar2->hostScriptContext,this,(this->errorObject).ptr);
      ThreadContext::DisposeOnLeaveScript(pSVar2->threadContext);
      pTVar5->reentrancySafeOrHandled = bVar8;
      LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)&se.bstrLine);
    }
    else {
      DVar12 = ExceptionCheck::Save();
      se.bstrLine = (BSTR)CONCAT44(se.bstrLine._4_4_,DVar12.handledExceptionType);
      (*pSStack_38->hostScriptContext->_vptr_HostScriptContext[0x14])
                (pSStack_38->hostScriptContext,this,(this->errorObject).ptr);
      ExceptionCheck::Restore((Data *)&se.bstrLine);
    }
    this->hadNotifyHostReady = true;
  }
  Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded\n");
  NotifyParentsAsNeeded(this);
LAB_00b0332c:
  CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_e8);
  return HVar10;
}

Assistant:

HRESULT SourceTextModuleRecord::ParseSource(__in_bcount(sourceLength) byte* sourceText, uint32 sourceLength, SRCINFO * srcInfo, Var* exceptionVar, bool isUtf8)
    {
        Assert(!wasParsed || sourceText == nullptr);
        Assert(parser == nullptr);
        Assert(exceptionVar != nullptr);
        HRESULT hr = NOERROR;

        // Return if loading failure has been reported
        if (sourceText == nullptr && wasParsed)
        {
            return hr;
        }

        ScriptContext* scriptContext = GetScriptContext();
        CompileScriptException se;
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        *exceptionVar = nullptr;
        if (!scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            JavascriptError *pError = scriptContext->GetLibrary()->CreateError();
            JavascriptError::SetErrorMessageProperties(pError, hr, _u("ES6Module not supported"), scriptContext);
            *exceptionVar = pError;
            return E_NOTIMPL;
        }

        // Mark module as root module if it currently has no parents
        // Note, if there are circular imports it may gain parents later
        if (parentModuleList == nullptr && promise == nullptr)
        {
            SetIsRootModule();
        }

        // Host indicates that the current module failed to load.
        if (sourceText == nullptr)
        {
            Assert(sourceLength == 0);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("Failed to load: %s\n"), this->GetSpecifierSz());
            hr = E_FAIL;

            // We cannot just use the buffer in the specifier string - need to make a copy here.
            const char16* moduleName = this->GetSpecifierSz();
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            JavascriptError *pError = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(pError, hr, allocatedString, scriptContext);
            *exceptionVar = pError;
        }
        else
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ParseSource(%s)\n"), this->GetSpecifierSz());
            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
                this->parser = Anew(allocator, Parser, scriptContext);
                srcInfo->moduleID = moduleId;

                LoadScriptFlag loadScriptFlag = (LoadScriptFlag)(LoadScriptFlag_Expression | LoadScriptFlag_Module |
                    LoadScriptFlag_disableAsmJs | (isUtf8 ? LoadScriptFlag_Utf8Source : LoadScriptFlag_None));

                Utf8SourceInfo* pResultSourceInfo = nullptr;
                this->parseTree = scriptContext->ParseScript(parser, sourceText,
                    sourceLength, srcInfo, &se, &pResultSourceInfo, Constants::ModuleCode,
                    loadScriptFlag, &sourceIndex, nullptr);
                this->pSourceInfo = pResultSourceInfo;
            }
            catch (Js::OutOfMemoryException)
            {
                hr = E_OUTOFMEMORY;
            }
            catch (Js::StackOverflowException)
            {
                hr = VBSERR_OutOfStack;
            }

            if (FAILED(hr))
            {
                se.ProcessError(nullptr, hr, nullptr);
            }
            else if (parseTree == nullptr)
            {
                hr = E_FAIL;
            }
            else
            {
                hr = PostParseProcess();
                if (hr == S_OK && this->errorObject != nullptr && this->hadNotifyHostReady)
                {
                    // This would be the case where the child module got error and current module has notified error already.
                    if (*exceptionVar == nullptr)
                    {
                        *exceptionVar = this->errorObject;
                    }

                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    return E_FAIL;
                }
            }
        }

        if (FAILED(hr))
        {
            if (*exceptionVar == nullptr)
            {
                const WCHAR * sourceUrl = this->GetSpecifierSz();

                *exceptionVar = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            }
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
            if (this->parser)
            {
                this->parseTree = nullptr;
                Adelete(allocator, this->parser);
                this->parser = nullptr;
            }
            if (this->errorObject == nullptr)
            {
                this->errorObject = *exceptionVar;
            }

            if (this->promise != nullptr)
            {
                SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, this->scriptContext, this, false);
            }

            // Notify host if current module is root module and the host hasn't been notified
            if (isRootModule && !hadNotifyHostReady)
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (ParseSource error)\n"), this->GetSpecifierSz());
                LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                {
                    scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                });

                hadNotifyHostReady = true;
            }

            // Notify parent if applicable
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded\n"));
            NotifyParentsAsNeeded();
        }
        return hr;
    }